

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O0

void __thiscall
helics::Federate::registerConnectorInterfacesJsonDetail(Federate *this,JsonBuffer *jsonBuffer)

{
  string_view message;
  string_view defVal;
  string_view defVal_00;
  string_view defVal_01;
  string_view defVal_02;
  string_view defVal_03;
  string_view defVal_04;
  string_view defVal_05;
  string_view defVal_06;
  string_view message_00;
  string_view message_01;
  string_view name;
  string_view inputType_00;
  string_view outputType_00;
  string_view name_00;
  string_view filterType;
  string_view translatorType;
  string_view endpointType;
  string_view units_00;
  format_args args;
  format_args args_00;
  string_view fmt;
  string_view fmt_00;
  bool bVar1;
  byte bVar2;
  json *pjVar3;
  undefined8 uVar4;
  Translator *pTVar5;
  const_reference jref;
  Federate *in_RSI;
  long in_RDI;
  Translator *translator;
  string emessage;
  bool global_1;
  string units;
  string etype;
  TranslatorTypes opType_1;
  string ttype;
  string key_1;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  *trans;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  value_type *__range2_1;
  Filter *filter;
  FilterTypes opType;
  string operation;
  bool global;
  bool useTypes;
  bool cloningFlag;
  string outputType;
  string inputType;
  string key;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  *filt;
  const_iterator __end2;
  const_iterator __begin2;
  value_type *__range2;
  json *iface;
  bool defaultGlobal;
  json *json;
  string *in_stack_fffffffffffff2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff2d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff2d8;
  string *in_stack_fffffffffffff2e0;
  string *in_stack_fffffffffffff2e8;
  json *key_00;
  string *in_stack_fffffffffffff2f0;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  *this_00;
  json *in_stack_fffffffffffff2f8;
  int level;
  Core **__args;
  Federate *in_stack_fffffffffffff300;
  allocator<char> *__a;
  char *in_stack_fffffffffffff308;
  char *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff310;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  allocator<char> *in_stack_fffffffffffff318;
  Federate *in_stack_fffffffffffff320;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  *in_stack_fffffffffffff328;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  *in_stack_fffffffffffff330;
  size_t in_stack_fffffffffffff340;
  char *in_stack_fffffffffffff348;
  undefined8 in_stack_fffffffffffff350;
  undefined4 in_stack_fffffffffffff358;
  undefined4 in_stack_fffffffffffff35c;
  iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
  *this_02;
  Federate *in_stack_fffffffffffff360;
  Federate *in_stack_fffffffffffff368;
  allocator<char> *in_stack_fffffffffffff370;
  allocator<char> *in_stack_fffffffffffff378;
  Federate *in_stack_fffffffffffff380;
  allocator<char> *in_stack_fffffffffffff388;
  allocator<char> *in_stack_fffffffffffff390;
  Federate *in_stack_fffffffffffff398;
  string *in_stack_fffffffffffff3b8;
  undefined7 in_stack_fffffffffffff3c0;
  undefined1 in_stack_fffffffffffff3c7;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  *in_stack_fffffffffffff3c8;
  Federate *section;
  anon_class_8_1_552cbcb6 in_stack_fffffffffffff3d0;
  anon_class_8_1_36d583d8 callback;
  undefined8 in_stack_fffffffffffff3d8;
  Federate *in_stack_fffffffffffff3e0;
  bool local_b2a;
  json *local_ae8;
  json *pjVar6;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_stack_fffffffffffff538;
  Federate *in_stack_fffffffffffff540;
  size_t in_stack_fffffffffffff548;
  JsonBuffer in_stack_fffffffffffff550;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  *in_stack_fffffffffffff558;
  Federate *in_stack_fffffffffffff560;
  Core *local_a78 [3];
  function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
  *in_stack_fffffffffffff5a0;
  string *in_stack_fffffffffffff5a8;
  json *in_stack_fffffffffffff5b0;
  char local_a18 [39];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9f1;
  Translator *local_9c0;
  allocator<char> local_9b1 [40];
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  local_989 [2];
  Translator *local_968;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  local_959 [2];
  function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
  *in_stack_fffffffffffff6c8;
  json *in_stack_fffffffffffff6d0;
  allocator<char> local_901 [40];
  iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
  local_8d9;
  Translator *local_8b8;
  allocator<char> local_8a9 [40];
  allocator<char> local_881 [48];
  allocator<char> local_851 [40];
  allocator<char> local_829 [33];
  Translator *local_808;
  allocator<char> local_7f9 [40];
  allocator<char> local_7d1 [33];
  __sv_type local_7b0;
  string *local_7a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *json_00;
  __sv_type in_stack_fffffffffffff870;
  undefined1 local_768 [32];
  __sv_type local_748;
  __sv_type local_738;
  __sv_type local_728;
  char *local_718;
  undefined8 local_710;
  undefined1 local_708 [39];
  undefined1 local_6e1 [73];
  undefined8 local_698;
  undefined8 uStack_690;
  allocator<char> local_679 [65];
  undefined8 local_638;
  undefined8 uStack_630;
  allocator<char> local_619 [65];
  __sv_type local_5d8;
  TranslatorTypes local_5c8;
  allocator<char> local_5c1 [33];
  __sv_type local_5a0;
  allocator<char> local_589 [33];
  undefined1 local_568 [32];
  undefined8 local_548;
  undefined8 uStack_540;
  allocator<char> local_531 [65];
  Federate *local_4f0;
  const_reference local_4a8;
  Filter *local_4a0;
  allocator<char> local_491 [33];
  Filter *local_470;
  allocator<char> local_461 [40];
  allocator<char> local_439 [33];
  Filter *local_418;
  allocator<char> local_409 [40];
  allocator<char> local_3e1 [33];
  __sv_type local_3c0;
  __sv_type local_3b0;
  __sv_type local_3a0;
  Filter *local_390;
  undefined4 local_384;
  __sv_type local_380;
  FilterTypes local_370;
  byte local_36c;
  allocator<char> local_36b;
  byte local_36a;
  allocator<char> local_369 [33];
  __sv_type local_348;
  allocator<char> local_331 [72];
  allocator<char> local_2e9 [38];
  undefined1 local_2c3;
  byte local_2c2;
  allocator<char> local_2c1 [40];
  byte local_299;
  undefined8 local_298;
  undefined8 uStack_290;
  allocator<char> local_279 [65];
  undefined8 local_238;
  undefined8 uStack_230;
  allocator<char> local_219 [65];
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  allocator<char> local_1b9 [65];
  reference local_178;
  const_reference local_130;
  json *local_128;
  json local_109 [2];
  undefined1 local_e1;
  undefined1 local_c8 [16];
  undefined8 local_b8;
  undefined1 *local_b0;
  char *local_a8;
  undefined8 uStack_a0;
  undefined1 *local_98;
  char *local_90;
  undefined8 uStack_88;
  undefined1 *local_80;
  undefined1 local_78 [16];
  undefined8 local_68;
  undefined1 *local_60;
  char *local_58;
  undefined8 uStack_50;
  undefined1 *local_40;
  char *local_38;
  undefined8 uStack_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined8 *local_18;
  undefined1 *local_10;
  undefined8 *local_8;
  
  pjVar3 = fileops::JsonBuffer::json_abi_cxx11_((JsonBuffer *)in_RSI);
  local_e1 = 0;
  pjVar6 = local_109;
  local_ae8 = pjVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff310,in_stack_fffffffffffff308,
             (allocator<char> *)in_stack_fffffffffffff300);
  fileops::replaceIfMember
            ((json *)in_stack_fffffffffffff2d0,in_stack_fffffffffffff2c8,(bool *)0x315ac4);
  std::__cxx11::string::~string(in_stack_fffffffffffff2d0);
  std::allocator<char>::~allocator((allocator<char> *)local_109);
  bVar1 = nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::contains<const_char_(&)[11],_0>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)in_stack_fffffffffffff2f0,(char (*) [11])in_stack_fffffffffffff2e8);
  key_00 = local_ae8;
  if (bVar1) {
    local_ae8 = nlohmann::json_abi_v3_11_3::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                ::operator[]<char_const>
                          ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                            *)in_stack_fffffffffffff320,(char *)in_stack_fffffffffffff318);
  }
  local_128 = local_ae8;
  bVar1 = nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::contains<const_char_(&)[8],_0>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)in_stack_fffffffffffff2f0,(char (*) [8])in_stack_fffffffffffff2e8);
  if (bVar1) {
    local_130 = nlohmann::json_abi_v3_11_3::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                ::operator[]<char_const>
                          ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                            *)in_stack_fffffffffffff320,(char *)in_stack_fffffffffffff318);
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::begin((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
             *)in_stack_fffffffffffff2c8);
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::end((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
           *)in_stack_fffffffffffff2c8);
    while (bVar1 = nlohmann::json_abi_v3_11_3::detail::
                   iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                   ::
                   operator!=<nlohmann::json_abi_v3_11_3::detail::iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_nullptr>
                             ((iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                               *)in_stack_fffffffffffff2d0,
                              (iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                               *)in_stack_fffffffffffff2c8), bVar1) {
      local_178 = nlohmann::json_abi_v3_11_3::detail::
                  iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                  ::operator*((iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                               *)CONCAT44(in_stack_fffffffffffff35c,in_stack_fffffffffffff358));
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff310,in_stack_fffffffffffff308,
                 (allocator<char> *)in_stack_fffffffffffff300);
      local_1d8 = 0;
      uStack_1d0 = 0;
      defVal._M_str = in_stack_fffffffffffff308;
      defVal._M_len = (size_t)in_stack_fffffffffffff300;
      fileops::getOrDefault(in_stack_fffffffffffff2f8,in_stack_fffffffffffff2f0,defVal);
      std::__cxx11::string::~string(in_stack_fffffffffffff2d0);
      std::allocator<char>::~allocator(local_1b9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff310,in_stack_fffffffffffff308,
                 (allocator<char> *)in_stack_fffffffffffff300);
      local_238 = 0;
      uStack_230 = 0;
      defVal_00._M_str = in_stack_fffffffffffff308;
      defVal_00._M_len = (size_t)in_stack_fffffffffffff300;
      fileops::getOrDefault(in_stack_fffffffffffff2f8,in_stack_fffffffffffff2f0,defVal_00);
      std::__cxx11::string::~string(in_stack_fffffffffffff2d0);
      std::allocator<char>::~allocator(local_219);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff310,in_stack_fffffffffffff308,
                 (allocator<char> *)in_stack_fffffffffffff300);
      local_298 = 0;
      uStack_290 = 0;
      defVal_01._M_str = in_stack_fffffffffffff308;
      defVal_01._M_len = (size_t)in_stack_fffffffffffff300;
      fileops::getOrDefault(in_stack_fffffffffffff2f8,in_stack_fffffffffffff2f0,defVal_01);
      std::__cxx11::string::~string(in_stack_fffffffffffff2d0);
      std::allocator<char>::~allocator(local_279);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff310,in_stack_fffffffffffff308,
                 (allocator<char> *)in_stack_fffffffffffff300);
      bVar1 = fileops::getOrDefault
                        ((json *)in_stack_fffffffffffff2d0,(string *)in_stack_fffffffffffff2c8,false
                        );
      std::__cxx11::string::~string(in_stack_fffffffffffff2d0);
      std::allocator<char>::~allocator(local_2c1);
      local_299 = bVar1;
      bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x315e2d);
      local_b2a = false;
      if (bVar1) {
        local_b2a = CLI::std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               0x315e4c);
      }
      local_2c2 = ~local_b2a & 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff310,in_stack_fffffffffffff308,
                 (allocator<char> *)in_stack_fffffffffffff300);
      bVar1 = fileops::getOrDefault
                        ((json *)in_stack_fffffffffffff2d0,(string *)in_stack_fffffffffffff2c8,false
                        );
      std::__cxx11::string::~string(in_stack_fffffffffffff2d0);
      std::allocator<char>::~allocator(local_2e9);
      local_2c3 = bVar1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff310,in_stack_fffffffffffff308,
                 (allocator<char> *)in_stack_fffffffffffff300);
      local_36a = 0;
      local_36c = 0;
      if ((local_299 & 1) == 0) {
        std::allocator<char>::allocator();
        local_36c = 1;
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffff310,in_stack_fffffffffffff308,
                   (allocator<char> *)in_stack_fffffffffffff300);
      }
      else {
        std::allocator<char>::allocator();
        local_36a = 1;
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffff310,in_stack_fffffffffffff308,
                   (allocator<char> *)in_stack_fffffffffffff300);
      }
      local_348 = std::__cxx11::string::operator_cast_to_basic_string_view
                            (in_stack_fffffffffffff2d0);
      defVal_02._M_str = in_stack_fffffffffffff308;
      defVal_02._M_len = (size_t)in_stack_fffffffffffff300;
      fileops::getOrDefault(in_stack_fffffffffffff2f8,in_stack_fffffffffffff2f0,defVal_02);
      std::__cxx11::string::~string(in_stack_fffffffffffff2d0);
      if ((local_36c & 1) != 0) {
        std::allocator<char>::~allocator(&local_36b);
      }
      if ((local_36a & 1) != 0) {
        std::allocator<char>::~allocator(local_369);
      }
      std::__cxx11::string::~string(in_stack_fffffffffffff2d0);
      std::allocator<char>::~allocator(local_331);
      local_380 = std::__cxx11::string::operator_cast_to_basic_string_view
                            (in_stack_fffffffffffff2d0);
      filterType._M_str = (char *)in_stack_fffffffffffff378;
      filterType._M_len = (size_t)in_stack_fffffffffffff370;
      local_370 = filterTypeFromString(filterType);
      bVar1 = checkValidFilterType
                        (in_stack_fffffffffffff3e0,SUB81((ulong)in_stack_fffffffffffff3d8 >> 0x38,0)
                         ,(FilterTypes)in_stack_fffffffffffff3d8,
                         (string *)in_stack_fffffffffffff3d0.filter);
      if (bVar1) {
        local_3a0 = std::__cxx11::string::operator_cast_to_basic_string_view
                              (in_stack_fffffffffffff2d0);
        local_3b0 = std::__cxx11::string::operator_cast_to_basic_string_view
                              (in_stack_fffffffffffff2d0);
        local_3c0 = std::__cxx11::string::operator_cast_to_basic_string_view
                              (in_stack_fffffffffffff2d0);
        name._M_str = (char *)in_stack_fffffffffffff330;
        name._M_len = (size_t)in_stack_fffffffffffff328;
        inputType_00._M_str = in_stack_fffffffffffff348;
        inputType_00._M_len = in_stack_fffffffffffff340;
        outputType_00._M_str._0_4_ = in_stack_fffffffffffff358;
        outputType_00._M_len = in_stack_fffffffffffff350;
        outputType_00._M_str._4_4_ = in_stack_fffffffffffff35c;
        in_stack_fffffffffffff2c8 = (string *)local_3b0._M_len;
        in_stack_fffffffffffff2d0 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3b0._M_str;
        in_stack_fffffffffffff2d8 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3c0._M_len;
        in_stack_fffffffffffff2e0 = (string *)local_3c0._M_str;
        local_390 = generateFilter(in_stack_fffffffffffff320,
                                   SUB81((ulong)in_stack_fffffffffffff318 >> 0x38,0),
                                   SUB81((ulong)in_stack_fffffffffffff318 >> 0x30,0),name,
                                   (FilterTypes)in_stack_fffffffffffff318,inputType_00,outputType_00
                                  );
        loadOptions<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,helics::Filter>
                  (in_stack_fffffffffffff560,in_stack_fffffffffffff558,
                   (Filter *)in_stack_fffffffffffff550.reference);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffff310,in_stack_fffffffffffff308,
                   (allocator<char> *)in_stack_fffffffffffff300);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffff310,in_stack_fffffffffffff308,
                   (allocator<char> *)in_stack_fffffffffffff300);
        local_418 = local_390;
        addTargetVariations<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,helics::Federate::registerConnectorInterfacesJsonDetail(helics::fileops::JsonBuffer_const&)::__3>
                  (in_stack_fffffffffffff3c8,
                   (string *)CONCAT17(in_stack_fffffffffffff3c7,in_stack_fffffffffffff3c0),
                   in_stack_fffffffffffff3b8,in_stack_fffffffffffff3d0);
        std::__cxx11::string::~string(in_stack_fffffffffffff2d0);
        std::allocator<char>::~allocator(local_409);
        std::__cxx11::string::~string(in_stack_fffffffffffff2d0);
        std::allocator<char>::~allocator(local_3e1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffff310,in_stack_fffffffffffff308,
                   (allocator<char> *)in_stack_fffffffffffff300);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffff310,in_stack_fffffffffffff308,
                   (allocator<char> *)in_stack_fffffffffffff300);
        local_470 = local_390;
        addTargetVariations<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,helics::Federate::registerConnectorInterfacesJsonDetail(helics::fileops::JsonBuffer_const&)::__4>
                  (in_stack_fffffffffffff3c8,
                   (string *)CONCAT17(in_stack_fffffffffffff3c7,in_stack_fffffffffffff3c0),
                   in_stack_fffffffffffff3b8,in_stack_fffffffffffff3d0);
        std::__cxx11::string::~string(in_stack_fffffffffffff2d0);
        std::allocator<char>::~allocator(local_461);
        std::__cxx11::string::~string(in_stack_fffffffffffff2d0);
        std::allocator<char>::~allocator(local_439);
        if ((local_299 & 1) != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffff310,in_stack_fffffffffffff308,
                     (allocator<char> *)in_stack_fffffffffffff300);
          local_4a0 = local_390;
          addTargets<helics::Federate::registerConnectorInterfacesJsonDetail(helics::fileops::JsonBuffer_const&)::__5>
                    (in_stack_fffffffffffff3c8,
                     (string *)CONCAT17(in_stack_fffffffffffff3c7,in_stack_fffffffffffff3c0),
                     in_stack_fffffffffffff3d0);
          std::__cxx11::string::~string(in_stack_fffffffffffff2d0);
          std::allocator<char>::~allocator(local_491);
        }
        loadPropertiesJson<helics::Filter>
                  (in_stack_fffffffffffff540,(Filter *)in_stack_fffffffffffff538.values_,pjVar6,
                   SUB81((ulong)pjVar3 >> 0x38,0));
        local_384 = 0;
      }
      else {
        local_384 = 3;
      }
      std::__cxx11::string::~string(in_stack_fffffffffffff2d0);
      std::__cxx11::string::~string(in_stack_fffffffffffff2d0);
      std::__cxx11::string::~string(in_stack_fffffffffffff2d0);
      std::__cxx11::string::~string(in_stack_fffffffffffff2d0);
      nlohmann::json_abi_v3_11_3::detail::
      iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
      ::operator++((iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                    *)in_stack_fffffffffffff2d0);
    }
  }
  bVar1 = nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::contains<const_char_(&)[12],_0>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)in_stack_fffffffffffff2f0,(char (*) [12])in_stack_fffffffffffff2e8);
  uVar4 = in_stack_fffffffffffff870._M_len;
  if (bVar1) {
    local_4a8 = nlohmann::json_abi_v3_11_3::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                ::operator[]<char_const>
                          ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                            *)in_stack_fffffffffffff320,(char *)in_stack_fffffffffffff318);
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::begin((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
             *)in_stack_fffffffffffff2c8);
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::end((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
           *)in_stack_fffffffffffff2c8);
    this_02 = (iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
               *)CONCAT44(in_stack_fffffffffffff35c,in_stack_fffffffffffff358);
    while( true ) {
      bVar1 = nlohmann::json_abi_v3_11_3::detail::
              iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
              ::
              operator!=<nlohmann::json_abi_v3_11_3::detail::iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_nullptr>
                        ((iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                          *)in_stack_fffffffffffff2d0,
                         (iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                          *)in_stack_fffffffffffff2c8);
      uVar4 = in_stack_fffffffffffff870._M_len;
      if (!bVar1) break;
      local_4f0 = (Federate *)
                  nlohmann::json_abi_v3_11_3::detail::
                  iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                  ::operator*(this_02);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff310,in_stack_fffffffffffff308,
                 (allocator<char> *)in_stack_fffffffffffff300);
      local_548 = 0;
      uStack_540 = 0;
      defVal_03._M_str = in_stack_fffffffffffff308;
      defVal_03._M_len = (size_t)in_stack_fffffffffffff300;
      fileops::getOrDefault(in_stack_fffffffffffff2f8,in_stack_fffffffffffff2f0,defVal_03);
      std::__cxx11::string::~string(in_stack_fffffffffffff2d0);
      std::allocator<char>::~allocator(local_531);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff310,in_stack_fffffffffffff308,
                 (allocator<char> *)in_stack_fffffffffffff300);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff310,in_stack_fffffffffffff308,
                 (allocator<char> *)in_stack_fffffffffffff300);
      local_5a0 = std::__cxx11::string::operator_cast_to_basic_string_view
                            (in_stack_fffffffffffff2d0);
      defVal_04._M_str = in_stack_fffffffffffff308;
      defVal_04._M_len = (size_t)in_stack_fffffffffffff300;
      fileops::getOrDefault(in_stack_fffffffffffff2f8,in_stack_fffffffffffff2f0,defVal_04);
      std::__cxx11::string::~string(in_stack_fffffffffffff2d0);
      std::allocator<char>::~allocator(local_5c1);
      std::__cxx11::string::~string(in_stack_fffffffffffff2d0);
      std::allocator<char>::~allocator(local_589);
      local_5d8 = std::__cxx11::string::operator_cast_to_basic_string_view
                            (in_stack_fffffffffffff2d0);
      translatorType._M_str = (char *)in_stack_fffffffffffff378;
      translatorType._M_len = (size_t)in_stack_fffffffffffff370;
      local_5c8 = translatorTypeFromString(translatorType);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff310,in_stack_fffffffffffff308,
                 (allocator<char> *)in_stack_fffffffffffff300);
      local_638 = 0;
      uStack_630 = 0;
      defVal_05._M_str = in_stack_fffffffffffff308;
      defVal_05._M_len = (size_t)in_stack_fffffffffffff300;
      fileops::getOrDefault(in_stack_fffffffffffff2f8,in_stack_fffffffffffff2f0,defVal_05);
      std::__cxx11::string::~string(in_stack_fffffffffffff2d0);
      std::allocator<char>::~allocator(local_619);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff310,in_stack_fffffffffffff308,
                 (allocator<char> *)in_stack_fffffffffffff300);
      local_698 = 0;
      uStack_690 = 0;
      defVal_06._M_str = in_stack_fffffffffffff308;
      defVal_06._M_len = (size_t)in_stack_fffffffffffff300;
      fileops::getOrDefault(in_stack_fffffffffffff2f8,in_stack_fffffffffffff2f0,defVal_06);
      std::__cxx11::string::~string(in_stack_fffffffffffff2d0);
      std::allocator<char>::~allocator(local_679);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff310,in_stack_fffffffffffff308,
                 (allocator<char> *)in_stack_fffffffffffff300);
      fileops::replaceIfMember
                ((json *)in_stack_fffffffffffff2f0,in_stack_fffffffffffff2e8,
                 in_stack_fffffffffffff2e0);
      std::__cxx11::string::~string(in_stack_fffffffffffff2d0);
      std::allocator<char>::~allocator((allocator<char> *)(local_6e1 + 0x28));
      callback.translator = (Translator *)local_6e1;
      section = local_4f0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff310,in_stack_fffffffffffff308,
                 (allocator<char> *)in_stack_fffffffffffff300);
      bVar2 = fileops::getOrDefault
                        ((json *)in_stack_fffffffffffff2d0,(string *)in_stack_fffffffffffff2c8,false
                        );
      std::__cxx11::string::~string(in_stack_fffffffffffff2d0);
      std::allocator<char>::~allocator((allocator<char> *)local_6e1);
      local_6e1[0x27] = bVar2 & 1;
      if (local_5c8 == UNRECOGNIZED) {
        if ((*(byte *)(in_RDI + 10) & 1) != 0) {
          local_718 = "unrecognized translator type:{}";
          local_710 = 0x1f;
          local_28 = local_708;
          local_38 = "unrecognized translator type:{}";
          uStack_30 = 0x1f;
          local_40 = local_568;
          local_58 = "unrecognized translator type:{}";
          uStack_50 = 0x1f;
          ::fmt::v11::detail::value<fmt::v11::context>::
          value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
                    ((value<fmt::v11::context> *)in_stack_fffffffffffff2e0,in_stack_fffffffffffff2d8
                    );
          level = (int)((ulong)in_stack_fffffffffffff2f8 >> 0x20);
          local_18 = &local_68;
          local_20 = local_78;
          local_68 = 0xd;
          fmt.size_ = in_stack_fffffffffffff548;
          fmt.data_ = (char *)in_stack_fffffffffffff540;
          args.field_1.values_ = in_stack_fffffffffffff538.values_;
          args.desc_ = (unsigned_long_long)pjVar6;
          local_60 = local_20;
          ::fmt::v11::vformat_abi_cxx11_(fmt,args);
          local_728 = std::__cxx11::string::operator_cast_to_basic_string_view
                                (in_stack_fffffffffffff2d0);
          message_00._M_str = (char *)in_stack_fffffffffffff310;
          message_00._M_len = (size_t)in_stack_fffffffffffff308;
          logMessage(in_stack_fffffffffffff300,level,message_00);
          uVar4 = __cxa_allocate_exception(0x28);
          local_738 = std::__cxx11::string::operator_cast_to_basic_string_view
                                (in_stack_fffffffffffff2d0);
          message._M_str = (char *)in_stack_fffffffffffff2f0;
          message._M_len = (size_t)in_stack_fffffffffffff2e8;
          InvalidParameter::InvalidParameter((InvalidParameter *)in_stack_fffffffffffff2e0,message);
          __cxa_throw(uVar4,&InvalidParameter::typeinfo,InvalidParameter::~InvalidParameter);
        }
        local_80 = local_768;
        local_90 = "unrecognized translator operation:{}";
        uStack_88 = 0x24;
        local_98 = local_568;
        local_a8 = "unrecognized translator operation:{}";
        uStack_a0 = 0x24;
        ::fmt::v11::detail::value<fmt::v11::context>::
        value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
                  ((value<fmt::v11::context> *)in_stack_fffffffffffff2e0,in_stack_fffffffffffff2d8);
        local_8 = &local_b8;
        local_10 = local_c8;
        local_b8 = 0xd;
        fmt_00.size_ = in_stack_fffffffffffff548;
        fmt_00.data_ = (char *)in_stack_fffffffffffff540;
        args_00.field_1.values_ = in_stack_fffffffffffff538.values_;
        args_00.desc_ = (unsigned_long_long)pjVar6;
        local_b0 = local_10;
        ::fmt::v11::vformat_abi_cxx11_(fmt_00,args_00);
        local_748 = std::__cxx11::string::operator_cast_to_basic_string_view
                              (in_stack_fffffffffffff2d0);
        message_01._M_str = (char *)in_stack_fffffffffffff310;
        message_01._M_len = (size_t)in_stack_fffffffffffff308;
        logMessage(in_stack_fffffffffffff300,(int)((ulong)in_stack_fffffffffffff2f8 >> 0x20),
                   message_01);
        std::__cxx11::string::~string(in_stack_fffffffffffff2d0);
        local_384 = 5;
      }
      else {
        in_stack_fffffffffffff870 =
             std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffff2d0);
        _local_7a0 = std::__cxx11::string::operator_cast_to_basic_string_view
                               (in_stack_fffffffffffff2d0);
        local_7b0 = std::__cxx11::string::operator_cast_to_basic_string_view
                              (in_stack_fffffffffffff2d0);
        name_00._M_str = (char *)in_stack_fffffffffffff370;
        name_00._M_len = (size_t)in_stack_fffffffffffff368;
        endpointType._M_str = (char *)in_stack_fffffffffffff388;
        endpointType._M_len = (size_t)in_stack_fffffffffffff380;
        units_00._M_str = (char *)in_stack_fffffffffffff398;
        units_00._M_len = (size_t)in_stack_fffffffffffff390;
        in_stack_fffffffffffff2c8 = local_7a0;
        in_stack_fffffffffffff2d0 = json_00;
        in_stack_fffffffffffff2d8 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_7b0._M_len;
        in_stack_fffffffffffff2e0 = (string *)local_7b0._M_str;
        pTVar5 = generateTranslator(in_stack_fffffffffffff360,SUB81((ulong)this_02 >> 0x38,0),
                                    name_00,(TranslatorTypes)this_02,endpointType,units_00);
        loadOptions<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,helics::Translator>
                  (in_stack_fffffffffffff560,in_stack_fffffffffffff558,
                   (Translator *)in_stack_fffffffffffff550.reference);
        in_stack_fffffffffffff398 = local_4f0;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffff310,in_stack_fffffffffffff308,
                   (allocator<char> *)in_stack_fffffffffffff300);
        in_stack_fffffffffffff390 = local_7f9;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffff310,in_stack_fffffffffffff308,
                   (allocator<char> *)in_stack_fffffffffffff300);
        local_808 = pTVar5;
        addTargetVariations<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,helics::Federate::registerConnectorInterfacesJsonDetail(helics::fileops::JsonBuffer_const&)::__6>
                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)section,(string *)CONCAT17(bVar2,in_stack_fffffffffffff3c0),
                   in_stack_fffffffffffff3b8,callback);
        std::__cxx11::string::~string(in_stack_fffffffffffff2d0);
        std::allocator<char>::~allocator(local_7f9);
        std::__cxx11::string::~string(in_stack_fffffffffffff2d0);
        std::allocator<char>::~allocator(local_7d1);
        in_stack_fffffffffffff388 = local_829;
        in_stack_fffffffffffff380 = local_4f0;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffff310,in_stack_fffffffffffff308,
                   (allocator<char> *)in_stack_fffffffffffff300);
        in_stack_fffffffffffff378 = local_851;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffff310,in_stack_fffffffffffff308,
                   (allocator<char> *)in_stack_fffffffffffff300);
        local_881._33_8_ = pTVar5;
        addTargetVariations<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,helics::Federate::registerConnectorInterfacesJsonDetail(helics::fileops::JsonBuffer_const&)::__7>
                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)section,(string *)CONCAT17(bVar2,in_stack_fffffffffffff3c0),
                   in_stack_fffffffffffff3b8,callback);
        std::__cxx11::string::~string(in_stack_fffffffffffff2d0);
        std::allocator<char>::~allocator(local_851);
        std::__cxx11::string::~string(in_stack_fffffffffffff2d0);
        std::allocator<char>::~allocator(local_829);
        in_stack_fffffffffffff370 = local_881;
        in_stack_fffffffffffff368 = local_4f0;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffff310,in_stack_fffffffffffff308,
                   (allocator<char> *)in_stack_fffffffffffff300);
        in_stack_fffffffffffff360 = (Federate *)local_8a9;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffff310,in_stack_fffffffffffff308,
                   (allocator<char> *)in_stack_fffffffffffff300);
        local_8b8 = pTVar5;
        addTargetVariations<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,helics::Federate::registerConnectorInterfacesJsonDetail(helics::fileops::JsonBuffer_const&)::__8>
                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)section,(string *)CONCAT17(bVar2,in_stack_fffffffffffff3c0),
                   in_stack_fffffffffffff3b8,callback);
        std::__cxx11::string::~string(in_stack_fffffffffffff2d0);
        std::allocator<char>::~allocator(local_8a9);
        std::__cxx11::string::~string(in_stack_fffffffffffff2d0);
        std::allocator<char>::~allocator(local_881);
        this_02 = &local_8d9;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffff310,in_stack_fffffffffffff308,
                   (allocator<char> *)in_stack_fffffffffffff300);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffff310,in_stack_fffffffffffff308,
                   (allocator<char> *)in_stack_fffffffffffff300);
        addTargetVariations<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,helics::Federate::registerConnectorInterfacesJsonDetail(helics::fileops::JsonBuffer_const&)::__9>
                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)section,(string *)CONCAT17(bVar2,in_stack_fffffffffffff3c0),
                   in_stack_fffffffffffff3b8,callback);
        std::__cxx11::string::~string(in_stack_fffffffffffff2d0);
        std::allocator<char>::~allocator(local_901);
        std::__cxx11::string::~string(in_stack_fffffffffffff2d0);
        std::allocator<char>::~allocator((allocator<char> *)&local_8d9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffff310,in_stack_fffffffffffff308,
                   (allocator<char> *)in_stack_fffffffffffff300);
        in_stack_fffffffffffff330 = local_959;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffff310,in_stack_fffffffffffff308,
                   (allocator<char> *)in_stack_fffffffffffff300);
        local_968 = pTVar5;
        addTargetVariations<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,helics::Federate::registerConnectorInterfacesJsonDetail(helics::fileops::JsonBuffer_const&)::__10>
                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)section,(string *)CONCAT17(bVar2,in_stack_fffffffffffff3c0),
                   in_stack_fffffffffffff3b8,callback);
        std::__cxx11::string::~string(in_stack_fffffffffffff2d0);
        std::allocator<char>::~allocator((allocator<char> *)local_959);
        std::__cxx11::string::~string(in_stack_fffffffffffff2d0);
        std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffff6cf);
        in_stack_fffffffffffff328 = local_989;
        in_stack_fffffffffffff320 = local_4f0;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffff310,in_stack_fffffffffffff308,
                   (allocator<char> *)in_stack_fffffffffffff300);
        in_stack_fffffffffffff318 = local_9b1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffff310,in_stack_fffffffffffff308,
                   (allocator<char> *)in_stack_fffffffffffff300);
        local_9c0 = pTVar5;
        addTargetVariations<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,helics::Federate::registerConnectorInterfacesJsonDetail(helics::fileops::JsonBuffer_const&)::__11>
                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)section,(string *)CONCAT17(bVar2,in_stack_fffffffffffff3c0),
                   in_stack_fffffffffffff3b8,callback);
        std::__cxx11::string::~string(in_stack_fffffffffffff2d0);
        std::allocator<char>::~allocator(local_9b1);
        std::__cxx11::string::~string(in_stack_fffffffffffff2d0);
        std::allocator<char>::~allocator((allocator<char> *)local_989);
        loadPropertiesJson<helics::Translator>
                  (in_stack_fffffffffffff540,(Translator *)in_stack_fffffffffffff538.values_,pjVar6,
                   SUB81((ulong)pjVar3 >> 0x38,0));
        local_384 = 0;
      }
      std::__cxx11::string::~string(in_stack_fffffffffffff2d0);
      std::__cxx11::string::~string(in_stack_fffffffffffff2d0);
      std::__cxx11::string::~string(in_stack_fffffffffffff2d0);
      std::__cxx11::string::~string(in_stack_fffffffffffff2d0);
      nlohmann::json_abi_v3_11_3::detail::
      iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
      ::operator++((iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                    *)in_stack_fffffffffffff2d0);
    }
  }
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::basic_json(in_stack_fffffffffffff330,in_stack_fffffffffffff328);
  this_01 = &local_9f1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_01,in_stack_fffffffffffff308,(allocator<char> *)in_stack_fffffffffffff300);
  __s = local_a18;
  std::
  function<void(std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>)>
  ::
  function<helics::Federate::registerConnectorInterfacesJsonDetail(helics::fileops::JsonBuffer_const&)::__0,void>
            ((function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
              *)in_stack_fffffffffffff2e0,(anon_class_8_1_8991fb9c *)in_stack_fffffffffffff2d8);
  arrayPairProcess(in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8,in_stack_fffffffffffff5a0);
  CLI::std::
  function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
  ::~function((function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
               *)0x317d2f);
  std::__cxx11::string::~string(in_stack_fffffffffffff2d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_9f1);
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                 *)in_stack_fffffffffffff2d0);
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::basic_json(in_stack_fffffffffffff330,in_stack_fffffffffffff328);
  __a = (allocator<char> *)&stack0xfffffffffffff5af;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_01,__s,__a);
  __args = local_a78;
  std::
  function<void(std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>)>
  ::
  function<helics::Federate::registerConnectorInterfacesJsonDetail(helics::fileops::JsonBuffer_const&)::__1,void>
            ((function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
              *)in_stack_fffffffffffff2e0,(anon_class_8_1_8991fb9c *)in_stack_fffffffffffff2d8);
  arrayPairProcess(in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8,in_stack_fffffffffffff5a0);
  CLI::std::
  function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
  ::~function((function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
               *)0x317deb);
  std::__cxx11::string::~string(in_stack_fffffffffffff2d0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffff5af);
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                 *)in_stack_fffffffffffff2d0);
  this_00 = (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
             *)&stack0xfffffffffffff560;
  pjVar6 = key_00;
  std::
  function<void(std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>)>
  ::
  function<helics::Federate::registerConnectorInterfacesJsonDetail(helics::fileops::JsonBuffer_const&)::__2,void>
            ((function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
              *)in_stack_fffffffffffff2e0,(anon_class_8_1_8991fb9c *)in_stack_fffffffffffff2d8);
  loadTags(in_stack_fffffffffffff6d0,in_stack_fffffffffffff6c8);
  CLI::std::
  function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
  ::~function((function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
               *)0x317e67);
  bVar1 = nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::contains<const_char_(&)[7],_0>(this_00,(char (*) [7])key_00);
  if (bVar1) {
    jref = nlohmann::json_abi_v3_11_3::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
           ::operator[]<char_const>
                     ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                       *)in_stack_fffffffffffff320,(char *)in_stack_fffffffffffff318);
    fileops::JsonBuffer::JsonBuffer((JsonBuffer *)&stack0xfffffffffffff550,jref);
    registerConnectorInterfacesJsonDetail(in_RSI,(JsonBuffer *)pjVar6);
  }
  bVar1 = nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::contains<const_char_(&)[21],_0>(this_00,(char (*) [21])key_00);
  if ((bVar1) ||
     (bVar1 = nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::contains<const_char_(&)[30],_0>(this_00,(char (*) [30])key_00), bVar1)) {
    bVar1 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<helics::PotentialInterfacesManager,_std::default_delete<helics::PotentialInterfacesManager>_>
                        *)0x317ff4);
    if (!bVar1) {
      std::__shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>::get
                ((__shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2> *)(in_RDI + 0x18));
      std::make_unique<helics::PotentialInterfacesManager,helics::Core*,helics::Federate*>
                (__args,(Federate **)this_00);
      std::
      unique_ptr<helics::PotentialInterfacesManager,_std::default_delete<helics::PotentialInterfacesManager>_>
      ::operator=((unique_ptr<helics::PotentialInterfacesManager,_std::default_delete<helics::PotentialInterfacesManager>_>
                   *)in_stack_fffffffffffff2d0,
                  (unique_ptr<helics::PotentialInterfacesManager,_std::default_delete<helics::PotentialInterfacesManager>_>
                   *)in_stack_fffffffffffff2c8);
      std::
      unique_ptr<helics::PotentialInterfacesManager,_std::default_delete<helics::PotentialInterfacesManager>_>
      ::~unique_ptr((unique_ptr<helics::PotentialInterfacesManager,_std::default_delete<helics::PotentialInterfacesManager>_>
                     *)in_stack_fffffffffffff2d0);
    }
    std::
    unique_ptr<helics::PotentialInterfacesManager,_std::default_delete<helics::PotentialInterfacesManager>_>
    ::operator->((unique_ptr<helics::PotentialInterfacesManager,_std::default_delete<helics::PotentialInterfacesManager>_>
                  *)0x318078);
    PotentialInterfacesManager::loadPotentialInterfaces
              ((PotentialInterfacesManager *)uVar4,(json *)json_00);
    *(undefined1 *)(in_RDI + 0xf) = 1;
  }
  return;
}

Assistant:

void Federate::registerConnectorInterfacesJsonDetail(const fileops::JsonBuffer& jsonBuffer)
{
    using fileops::getOrDefault;
    const auto& json = jsonBuffer.json();
    bool defaultGlobal = false;
    fileops::replaceIfMember(json, "defaultglobal", defaultGlobal);

    const nlohmann::json& iface = (json.contains("interfaces")) ? json["interfaces"] : json;

    if (iface.contains("filters")) {
        for (const auto& filt : iface["filters"]) {
            const std::string key = getOrDefault(filt, "name", emptyStr);
            const std::string inputType = getOrDefault(filt, "inputType", emptyStr);
            const std::string outputType = getOrDefault(filt, "outputType", emptyStr);
            const bool cloningFlag = getOrDefault(filt, "cloning", false);
            const bool useTypes = !((inputType.empty()) && (outputType.empty()));
            const bool global = fileops::getOrDefault(filt, "global", defaultGlobal);
            const std::string operation =
                getOrDefault(filt,
                             "operation",
                             (cloningFlag) ? std::string("clone") : std::string("custom"));

            auto opType = filterTypeFromString(operation);
            if (!checkValidFilterType(useTypes, opType, operation)) {
                continue;
            }
            auto& filter =
                generateFilter(this, global, cloningFlag, key, opType, inputType, outputType);
            loadOptions(this, filt, filter);

            addTargetVariations(filt, "source", "endpoints", [&filter](const std::string& target) {
                filter.addSourceTarget(target);
            });
            addTargetVariations(filt,
                                "destination",
                                "endpoints",
                                [&filter](const std::string& target) {
                                    filter.addDestinationTarget(target);
                                });

            if (cloningFlag) {
                addTargets(filt, "delivery", [&filter](const std::string& target) {
                    static_cast<CloningFilter&>(filter).addDeliveryEndpoint(target);
                });
            }

            loadPropertiesJson(this, filter, filt, strictConfigChecking);
        }
    }
    if (iface.contains("translators")) {
        for (const auto& trans : iface["translators"]) {
            const std::string key = getOrDefault(trans, "name", emptyStr);

            std::string ttype = getOrDefault(trans, "type", std::string("custom"));
            auto opType = translatorTypeFromString(ttype);
            auto etype = fileops::getOrDefault(trans, "endpointtype", emptyStr);
            auto units = fileops::getOrDefault(trans, "unit", emptyStr);
            fileops::replaceIfMember(trans, "units", units);
            const bool global = fileops::getOrDefault(trans, "global", defaultGlobal);

            if (opType == TranslatorTypes::UNRECOGNIZED) {
                if (strictConfigChecking) {
                    const std::string emessage =
                        fmt::format("unrecognized translator type:{}", ttype);
                    logMessage(HELICS_LOG_LEVEL_ERROR, emessage);

                    throw(InvalidParameter(emessage));
                }
                logMessage(HELICS_LOG_LEVEL_WARNING,
                           fmt::format("unrecognized translator operation:{}", ttype));
                continue;
            }
            auto& translator = generateTranslator(this, global, key, opType, etype, units);
            loadOptions(this, trans, translator);

            addTargetVariations(trans,
                                "source",
                                "endpoints",
                                [&translator](const std::string& target) {
                                    translator.addSourceEndpoint(target);
                                });
            addTargetVariations(trans,
                                "destination",
                                "endpoints",
                                [&translator](const std::string& target) {
                                    translator.addDestinationEndpoint(target);
                                });
            addTargetVariations(trans,
                                "source",
                                "publications",
                                [&translator](const std::string& target) {
                                    translator.addPublication(target);
                                });
            addTargetVariations(trans,
                                "destination",
                                "inputs",
                                [&translator](const std::string& target) {
                                    translator.addInputTarget(target);
                                });
            addTargetVariations(trans,
                                "source",
                                "filters",
                                [&translator](const std::string& target) {
                                    translator.addSourceFilter(target);
                                });
            addTargetVariations(trans,
                                "destination",
                                "filters",
                                [&translator](const std::string& target) {
                                    translator.addDestinationFilter(target);
                                });
            loadPropertiesJson(this, translator, trans, strictConfigChecking);
        }
    }
    arrayPairProcess(json, "globals", [this](std::string_view key, std::string_view val) {
        setGlobal(key, val);
    });
    arrayPairProcess(json, "aliases", [this](std::string_view key, std::string_view val) {
        addAlias(key, val);
    });

    loadTags(json, [this](std::string_view tagname, std::string_view tagvalue) {
        this->setTag(tagname, tagvalue);
    });
    if (json.contains("helics")) {
        registerConnectorInterfacesJsonDetail(fileops::JsonBuffer(json["helics"]));
    }

    if (json.contains("potential_interfaces") || json.contains("potential_interface_templates")) {
        if (!potManager) {
            potManager = std::make_unique<PotentialInterfacesManager>(coreObject.get(), this);
        }
        potManager->loadPotentialInterfaces(json);
        hasPotentialInterfaces = true;
    }
}